

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_unix.cpp
# Opt level: O2

bool __thiscall
QNativeSocketEnginePrivate::setOption(QNativeSocketEnginePrivate *this,SocketOption opt,int v)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  long in_FS_OFFSET;
  bool bVar4;
  int level;
  int n;
  int v_local;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  v_local = v;
  cVar1 = (**(code **)(**(long **)&(this->super_QAbstractSocketEnginePrivate).field_0x8 + 0x78))();
  if ((cVar1 != '\0') && (opt != MaxStreamsSocketOption)) {
    if (opt == BindExclusively) {
      bVar4 = true;
      goto LAB_002168ad;
    }
    if (opt == NonBlockingSocketOption) {
      bVar4 = false;
      uVar2 = fcntl((int)this->socketDescriptor,3,0);
      if (uVar2 != 0xffffffff) {
        iVar3 = fcntl((int)this->socketDescriptor,4,(ulong)(uVar2 | 0x800));
        bVar4 = iVar3 != -1;
      }
      goto LAB_002168ad;
    }
    n = -0x55555556;
    level = -0x55555556;
    convertToLevelAndOption(opt,(this->super_QAbstractSocketEnginePrivate).socketProtocol,&level,&n)
    ;
    if (n != -1) {
      iVar3 = setsockopt((int)this->socketDescriptor,level,n,&v_local,4);
      bVar4 = iVar3 == 0;
      goto LAB_002168ad;
    }
  }
  bVar4 = false;
LAB_002168ad:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QNativeSocketEnginePrivate::setOption(QNativeSocketEngine::SocketOption opt, int v)
{
    Q_Q(QNativeSocketEngine);
    if (!q->isValid())
        return false;

    // handle non-setsockopt and specific cases first
    switch (opt) {
    case QNativeSocketEngine::NonBlockingSocketOption: {
        // Make the socket nonblocking.
#if !defined(Q_OS_VXWORKS)
        int flags = ::fcntl(socketDescriptor, F_GETFL, 0);
        if (flags == -1) {
#ifdef QNATIVESOCKETENGINE_DEBUG
            perror("QNativeSocketEnginePrivate::setOption(): fcntl(F_GETFL) failed");
#endif
            return false;
        }
        if (::fcntl(socketDescriptor, F_SETFL, flags | O_NONBLOCK) == -1) {
#ifdef QNATIVESOCKETENGINE_DEBUG
            perror("QNativeSocketEnginePrivate::setOption(): fcntl(F_SETFL) failed");
#endif
            return false;
        }
#else // Q_OS_VXWORKS
        int onoff = 1;

        if (qt_safe_ioctl(socketDescriptor, FIONBIO, &onoff) < 0) {

#ifdef QNATIVESOCKETENGINE_DEBUG
            perror("QNativeSocketEnginePrivate::setOption(): ioctl(FIONBIO, 1) failed");
#endif
            return false;
        }
#endif // Q_OS_VXWORKS
        return true;
    }
    case QNativeSocketEngine::BindExclusively:
        return true;

    case QNativeSocketEngine::MaxStreamsSocketOption: {
#ifndef QT_NO_SCTP
        sctp_initmsg sctpInitMsg;
        QT_SOCKOPTLEN_T sctpInitMsgSize = sizeof(sctpInitMsg);
        if (::getsockopt(socketDescriptor, SOL_SCTP, SCTP_INITMSG, &sctpInitMsg,
                         &sctpInitMsgSize) == 0) {
            sctpInitMsg.sinit_num_ostreams = sctpInitMsg.sinit_max_instreams = uint16_t(v);
            return ::setsockopt(socketDescriptor, SOL_SCTP, SCTP_INITMSG, &sctpInitMsg,
                                sctpInitMsgSize) == 0;
        }
#endif
        return false;
    }

    default:
        break;
    }

    int n, level;
    convertToLevelAndOption(opt, socketProtocol, level, n);
#if defined(SO_REUSEPORT) && !defined(Q_OS_LINUX)
    if (opt == QNativeSocketEngine::AddressReusable) {
        // on OS X, SO_REUSEADDR isn't sufficient to allow multiple binds to the
        // same port (which is useful for multicast UDP). SO_REUSEPORT is, but
        // we most definitely do not want to use this for TCP. See QTBUG-6305.
        if (socketType == QAbstractSocket::UdpSocket)
            n = SO_REUSEPORT;
    }
#endif

    if (n == -1)
        return false;
    return ::setsockopt(socketDescriptor, level, n, (char *) &v, sizeof(v)) == 0;
}